

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.hpp
# Opt level: O0

void __thiscall deci::parser_t::value_type::move<deci::ast_t*>(value_type *this,self_type *that)

{
  ast_t **u;
  self_type *that_local;
  value_type *this_local;
  
  u = as<deci::ast_t*>(that);
  emplace<deci::ast_t*,deci::ast_t*>(this,u);
  destroy<deci::ast_t*>(that);
  return;
}

Assistant:

void
    move (self_type&& that)
    {
      emplace<T> (std::move (that.as<T> ()));
      that.destroy<T> ();
    }